

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O2

void __thiscall
TasGrid::GridLocalPolynomial::evaluateHierarchicalFunctionsGPU
          (GridLocalPolynomial *this,double *gpu_x,int cpu_num_x,double *gpu_y)

{
  int iVar1;
  AccelerationContext *pAVar2;
  CudaLocalPolynomialData<double> *pCVar3;
  MultiIndexSet *pMVar4;
  TypeOneDRule TVar5;
  
  loadGpuBasis<double>(this);
  pAVar2 = (this->super_BaseCanonicalGrid).acceleration;
  iVar1 = this->order;
  TVar5 = RuleLocal::getRule(this->effective_rule);
  pMVar4 = &(this->super_BaseCanonicalGrid).points;
  if ((this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pMVar4 = &(this->super_BaseCanonicalGrid).needed;
  }
  pCVar3 = (this->gpu_cache)._M_t.
           super___uniq_ptr_impl<TasGrid::CudaLocalPolynomialData<double>,_std::default_delete<TasGrid::CudaLocalPolynomialData<double>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_TasGrid::CudaLocalPolynomialData<double>_*,_std::default_delete<TasGrid::CudaLocalPolynomialData<double>_>_>
           .super__Head_base<0UL,_TasGrid::CudaLocalPolynomialData<double>_*,_false>._M_head_impl;
  TasGpu::devalpwpoly<double>
            (pAVar2,iVar1,TVar5,(this->super_BaseCanonicalGrid).num_dimensions,cpu_num_x,
             pMVar4->cache_num_indexes,gpu_x,(pCVar3->nodes).gpu_data,(pCVar3->support).gpu_data,
             gpu_y);
  return;
}

Assistant:

void GridLocalPolynomial::evaluateHierarchicalFunctionsGPU(const double gpu_x[], int cpu_num_x, double *gpu_y) const{
    loadGpuBasis<double>();
    TasGpu::devalpwpoly(acceleration, order, RuleLocal::getRule(effective_rule), num_dimensions, cpu_num_x, getNumPoints(), gpu_x, gpu_cache->nodes.data(), gpu_cache->support.data(), gpu_y);
}